

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndPopup(void)

{
  if ((GImGui->CurrentWindow->Flags & 0x4000000) == 0) {
    __assert_fail("g.CurrentWindow->Flags & ImGuiWindowFlags_Popup",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x142a,"void ImGui::EndPopup()");
  }
  if (0 < (GImGui->CurrentPopupStack).Size) {
    NavMoveRequestTryWrapping(GImGui->CurrentWindow,2);
    End();
    return;
  }
  __assert_fail("g.CurrentPopupStack.Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x142b,"void ImGui::EndPopup()");
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui; (void)g;
    IM_ASSERT(g.CurrentWindow->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.CurrentPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy.
    NavMoveRequestTryWrapping(g.CurrentWindow, ImGuiNavMoveFlags_LoopY);

    End();
}